

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void sbc_F1(void)

{
  except = '\0';
  temp2 = getbyte(pc);
  temp1 = getbyte((ushort)y_reg + CONCAT11(RAM[(byte)(temp2 + 1)],RAM[temp2]));
  _AL = acc;
  _AH = temp1;
  ovr_f = '\0';
  carry_f = '\x01';
  pc = pc + 1;
  return;
}

Assistant:

void sbc_F1(void) {
    uint flags;
    uint answer;
    CLE;
    asm("push ax");

    temp2 = getbyte(pc);
    temp1 = getbyte(RAM[temp2] + 0x100 * RAM[(ubyte) (temp2 + 1)] + y_reg);

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("sbb AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("push AX");
    asm("pop answer");
    asm("pop AX");

    result_f = acc = answer;
    (flags & 0x800) ? (ovr_f = 1) : (ovr_f = 0);
    carry_f = (flags & 0x01) ^ 1;

    pc++;
}